

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_&,_const_convert_b_&> * __thiscall
Catch::ExprLhs<C_A_T_C_H_T_E_S_T_0()::type_const&>::operator==
          (BinaryExpr<const_type_&,_const_convert_b_&> *__return_storage_ptr__,
          ExprLhs<C_A_T_C_H_T_E_S_T_0()::type_const&> *this,convert_b *rhs)

{
  int iVar1;
  type *ptVar2;
  StringRef local_38;
  
  ptVar2 = *(type **)this;
  iVar1 = (ptVar2->super_strong_typedef<type,_int>).value_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar1 == 0;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e610;
  __return_storage_ptr__->m_lhs = ptVar2;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }